

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ExpressionTemplateTest::constructionAndAssignmentTest(ExpressionTemplateTest *this)

{
  int iVar1;
  value_type vVar2;
  value_type vVar3;
  reference piVar4;
  size_t z;
  unsigned_long uVar5;
  size_t x;
  size_t sVar6;
  size_t y;
  unsigned_long uVar7;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  Marray<int,_std::allocator<unsigned_long>_> r;
  size_t shape [3];
  allocator_type local_129;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_128;
  View<int,false,std::allocator<unsigned_long>> local_110 [8];
  Geometry<std::allocator<unsigned_long>_> local_108;
  View<int,false,std::allocator<unsigned_long>> local_d0 [8];
  Geometry<std::allocator<unsigned_long>_> local_c8;
  Marray<int,_std::allocator<unsigned_long>_> local_90;
  unsigned_long local_48 [3];
  
  local_48[0] = 2;
  local_48[1] = 3;
  local_48[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            (local_d0,local_48,(unsigned_long *)&stack0xffffffffffffffd0,this->dataInt_,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_90);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            (local_110,local_48,(unsigned_long *)&stack0xffffffffffffffd0,this->dataInt_ + 2,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_90);
  andres::
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  ::BinaryViewExpression
            (&local_128,
             (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
             local_d0,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_110);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<int,int,int>>,int>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
             (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>,_int>
              *)&local_128,&local_129);
  for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar7 != 3; uVar7 = uVar7 + 1) {
      for (sVar6 = 0; sVar6 != 2; sVar6 = sVar6 + 1) {
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&local_90,sVar6,uVar7,
                            uVar5);
        iVar1 = *piVar4;
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_128,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_d0,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                             *)local_110);
        vVar2 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_128,sVar6,uVar7,uVar5);
        local_129 = (allocator_type)(iVar1 == vVar2);
        test((bool *)&local_129);
      }
    }
  }
  andres::
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  ::BinaryViewExpression
            ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
              *)&local_128,
             (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
             local_d0,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_110);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
             (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
              *)&local_128);
  for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar7 != 3; uVar7 = uVar7 + 1) {
      for (sVar6 = 0; sVar6 != 2; sVar6 = sVar6 + 1) {
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&local_90,sVar6,uVar7,
                            uVar5);
        iVar1 = *piVar4;
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                    *)&local_128,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_d0,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                             *)local_110);
        vVar3 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                              *)&local_128,sVar6,uVar7,uVar5);
        local_129 = (allocator_type)(iVar1 == vVar3);
        test((bool *)&local_129);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_90);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_108);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_c8);
  return;
}

Assistant:

void ExpressionTemplateTest::constructionAndAssignmentTest()
{
    // Marray
    {
        std::size_t shape[] = {2, 3, 2};
        andres::View<int> v(shape, shape+3, dataInt_);
        andres::View<int> w(shape, shape+3, dataInt_ + 2);
        andres::Marray<int> r(v + w); // construction
        for(std::size_t z=0; z<2; ++z) {
            for(std::size_t y=0; y<3; ++y) {
                for(std::size_t x=0; x<2; ++x) {
                    test( r(x,y,z) == (v + w)(x,y,z) );
                }
            }
        }
        r = v * w; // assignment
        for(std::size_t z=0; z<2; ++z) {
            for(std::size_t y=0; y<3; ++y) {
                for(std::size_t x=0; x<2; ++x) {
                    test( r(x,y,z) == (v * w)(x,y,z) );
                }
            }
        }
    }
}